

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

XXH_errorcode VELOCYPACK_XXH64_update(XXH64_state_t *state,void *input,size_t len)

{
  ulong uVar1;
  XXH64_hash_t XVar2;
  XXH64_hash_t XVar3;
  long *plVar4;
  XXH64_hash_t XVar5;
  XXH64_hash_t XVar6;
  ulong uVar7;
  
  if (input == (void *)0x0) {
    return XXH_ERROR;
  }
  state->total_len = state->total_len + len;
  uVar1 = (ulong)state->memsize;
  if (uVar1 + len < 0x20) {
    memcpy((void *)((long)state->mem64 + uVar1),input,len);
    uVar1 = (ulong)((int)len + state->memsize);
  }
  else {
    plVar4 = (long *)(len + (long)input);
    if (uVar1 != 0) {
      memcpy((void *)((long)state->mem64 + uVar1),input,(ulong)(0x20 - state->memsize));
      uVar1 = state->mem64[0] * -0x3d4d51c2d82b14b1 + state->v1;
      state->v1 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
      uVar1 = state->mem64[1] * -0x3d4d51c2d82b14b1 + state->v2;
      state->v2 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
      uVar1 = state->mem64[2] * -0x3d4d51c2d82b14b1 + state->v3;
      state->v3 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
      uVar1 = state->mem64[3] * -0x3d4d51c2d82b14b1 + state->v4;
      state->v4 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
      input = (void *)((long)input + (ulong)(0x20 - state->memsize));
      state->memsize = 0;
    }
    if ((long *)((long)input + 0x20) <= plVar4) {
      XVar2 = state->v1;
      XVar3 = state->v2;
      XVar6 = state->v3;
      XVar5 = state->v4;
      do {
        uVar1 = *input * -0x3d4d51c2d82b14b1 + XVar2;
        XVar2 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
        uVar1 = *(long *)((long)input + 8) * -0x3d4d51c2d82b14b1 + XVar3;
        uVar7 = *(long *)((long)input + 0x10) * -0x3d4d51c2d82b14b1 + XVar6;
        XVar3 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
        XVar6 = (uVar7 * 0x80000000 | uVar7 >> 0x21) * -0x61c8864e7a143579;
        uVar1 = *(long *)((long)input + 0x18) * -0x3d4d51c2d82b14b1 + XVar5;
        XVar5 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
        input = (void *)((long)input + 0x20);
      } while (input <= plVar4 + -4);
      state->v1 = XVar2;
      state->v2 = XVar3;
      state->v3 = XVar6;
      state->v4 = XVar5;
    }
    if (plVar4 <= input) {
      return XXH_OK;
    }
    uVar1 = (long)plVar4 - (long)input;
    memcpy(state->mem64,input,uVar1);
  }
  state->memsize = (XXH32_hash_t)uVar1;
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH64_update(XXH64_state_t* state,
                                          const void* input, size_t len) {
  if (input == NULL)
#if defined(XXH_ACCEPT_NULL_INPUT_POINTER) && \
    (XXH_ACCEPT_NULL_INPUT_POINTER >= 1)
    return XXH_OK;
#else
    return XXH_ERROR;
#endif

  {
    const xxh_u8* p = (const xxh_u8*)input;
    const xxh_u8* const bEnd = p + len;

    state->total_len += len;

    if (state->memsize + len < 32) { /* fill in tmp buffer */
      XXH_memcpy(((xxh_u8*)state->mem64) + state->memsize, input, len);
      state->memsize += (xxh_u32)len;
      return XXH_OK;
    }

    if (state->memsize) { /* tmp buffer is full */
      XXH_memcpy(((xxh_u8*)state->mem64) + state->memsize, input,
                 32 - state->memsize);
      state->v1 = XXH64_round(state->v1, XXH_readLE64(state->mem64 + 0));
      state->v2 = XXH64_round(state->v2, XXH_readLE64(state->mem64 + 1));
      state->v3 = XXH64_round(state->v3, XXH_readLE64(state->mem64 + 2));
      state->v4 = XXH64_round(state->v4, XXH_readLE64(state->mem64 + 3));
      p += 32 - state->memsize;
      state->memsize = 0;
    }

    if (p + 32 <= bEnd) {
      const xxh_u8* const limit = bEnd - 32;
      xxh_u64 v1 = state->v1;
      xxh_u64 v2 = state->v2;
      xxh_u64 v3 = state->v3;
      xxh_u64 v4 = state->v4;

      do {
        v1 = XXH64_round(v1, XXH_readLE64(p));
        p += 8;
        v2 = XXH64_round(v2, XXH_readLE64(p));
        p += 8;
        v3 = XXH64_round(v3, XXH_readLE64(p));
        p += 8;
        v4 = XXH64_round(v4, XXH_readLE64(p));
        p += 8;
      } while (p <= limit);

      state->v1 = v1;
      state->v2 = v2;
      state->v3 = v3;
      state->v4 = v4;
    }

    if (p < bEnd) {
      XXH_memcpy(state->mem64, p, (size_t)(bEnd - p));
      state->memsize = (unsigned)(bEnd - p);
    }
  }

  return XXH_OK;
}